

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

void Edg_ManCollectCritEdges(Gia_Man_t *p,Vec_Wec_t *vEdges,int DelayMax)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int i;
  int iVar4;
  
  if ((p->vEdge1 != (Vec_Int_t *)0x0) && (p->vEdge2 != (Vec_Int_t *)0x0)) {
    for (iVar4 = 0; iVar4 < vEdges->nSize; iVar4 = iVar4 + 1) {
      pVVar3 = Vec_WecEntry(vEdges,iVar4);
      pVVar3->nSize = 0;
    }
    vEdges->nSize = 0;
    Vec_WecGrow(vEdges,DelayMax + 1);
    vEdges->nSize = DelayMax + 1;
    iVar4 = 1;
    do {
      if (p->nObjs <= iVar4) {
        iVar4 = 1;
        do {
          if (vEdges->nSize <= iVar4) {
            return;
          }
          pVVar3 = Vec_WecEntry(vEdges,iVar4);
          iVar4 = iVar4 + 1;
        } while (0 < pVVar3->nSize);
        __assert_fail("Vec_IntSize(vLevel) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                      ,0x302,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
      }
      iVar1 = Gia_ObjIsLut2(p,iVar4);
      if (iVar1 != 0) {
        iVar1 = Vec_IntEntry(p->vEdgeDelay,iVar4);
        iVar2 = Vec_IntEntry(p->vEdgeDelayR,iVar4);
        if (DelayMax < iVar2 + iVar1) {
          __assert_fail("Delay1 + Delay2 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                        ,0x2fb,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
        }
        if (iVar2 + iVar1 == DelayMax) {
          Vec_WecPush(vEdges,iVar1,iVar4);
        }
      }
      iVar4 = iVar4 + 1;
    } while( true );
  }
  __assert_fail("p->vEdge1 && p->vEdge2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,0x2f4,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
}

Assistant:

void Edg_ManCollectCritEdges( Gia_Man_t * p, Vec_Wec_t * vEdges, int DelayMax )
{
    Vec_Int_t * vLevel;
    int k, iLut, Delay1, Delay2;
    assert( p->vEdge1 && p->vEdge2 );
    Vec_WecClear( vEdges );
    Vec_WecInit( vEdges, DelayMax + 1 );
    Gia_ManForEachLut2( p, iLut )
    {
        Delay1 = Vec_IntEntry( p->vEdgeDelay, iLut );
        Delay2 = Vec_IntEntry( p->vEdgeDelayR, iLut );
        assert( Delay1 + Delay2 <= DelayMax );
        if ( Delay1 + Delay2 == DelayMax )
            Vec_WecPush( vEdges, Delay1, iLut );
    }
    // every level should have critical nodes, except the first one
    //Vec_WecPrint( vEdges, 0 );
    Vec_WecForEachLevelStart( vEdges, vLevel, k, 1 )
        assert( Vec_IntSize(vLevel) > 0 );
}